

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall restincurl::Worker::Init(Worker *this)

{
  CURLM *pCVar1;
  runtime_error *this_00;
  
  pCVar1 = (CURLM *)curl_multi_init();
  this->handle_ = pCVar1;
  if (pCVar1 != (CURLM *)0x0) {
    curl_multi_setopt(pCVar1,6,0x20);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"curl_multi_init() failed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Init() {
            if ((handle_ = curl_multi_init()) == nullptr) {
                throw std::runtime_error("curl_multi_init() failed");
            }

            curl_multi_setopt(handle_, CURLMOPT_MAXCONNECTS, RESTINCURL_MAX_CONNECTIONS);
        }